

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::recoverFromError(Reader *this,TokenType skipUntilToken)

{
  bool bVar1;
  int in_ESI;
  size_type in_RDI;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *unaff_retaddr;
  Token skip;
  int errorCount;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Reader *in_stack_ffffffffffffffe0;
  
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::size
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)0x1238e0);
  do {
    bVar1 = readToken(in_stack_ffffffffffffffe0,
                      (Token *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (!bVar1) {
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
                (unaff_retaddr,in_RDI);
    }
  } while ((in_stack_ffffffffffffffd8 != in_ESI) && (in_stack_ffffffffffffffd8 != 0));
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
            (unaff_retaddr,in_RDI);
  return false;
}

Assistant:

bool Reader::recoverFromError(TokenType skipUntilToken) {
  int errorCount = int(errors_.size());
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}